

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cProgramInterfaceQueryTests.cpp
# Opt level: O3

string * __thiscall
gl4cts::(anonymous_namespace)::UniformSimple::VertexShader_abi_cxx11_
          (string *__return_storage_ptr__,void *this)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "#version 430                         \nin vec4 position;                    \nuniform vec4 repos;                  \nvoid main(void)                      \n{                                    \n    gl_Position = position + repos;  \n}"
             ,"");
  return __return_storage_ptr__;
}

Assistant:

virtual std::string VertexShader()
	{
		return "#version 430                         \n"
			   "in vec4 position;                    \n"
			   "uniform vec4 repos;                  \n"
			   "void main(void)                      \n"
			   "{                                    \n"
			   "    gl_Position = position + repos;  \n"
			   "}";
	}